

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_andnot_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  byte bVar1;
  void **ppvVar2;
  void *pvVar3;
  uint16_t *puVar4;
  int iVar5;
  int iVar6;
  byte type2;
  _Bool _Var7;
  ulong uVar8;
  int iVar9;
  array_container_t *paVar10;
  uint8_t uVar11;
  uint uVar12;
  uint32_t new_begin;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  array_container_t *paVar17;
  uint uVar18;
  uint32_t uVar19;
  int iVar20;
  ulong uVar21;
  uint32_t begin;
  uint uVar22;
  uint16_t uVar23;
  int iVar24;
  long lVar25;
  bool bVar26;
  uint8_t result_type;
  uint8_t local_7b;
  ushort local_7a;
  array_container_t *local_78;
  array_container_t *local_70;
  int local_64;
  ulong local_60;
  uint local_58;
  uint32_t local_54;
  roaring_bitmap_t *local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  if (x1 == x2) {
    __assert_fail("x1 != x2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x3ec9,
                  "void roaring_bitmap_andnot_inplace(roaring_bitmap_t *, const roaring_bitmap_t *)"
                 );
  }
  local_7b = '\0';
  uVar12 = (x2->high_low_container).size;
  if (uVar12 == 0) {
    return;
  }
  uVar19 = (x1->high_low_container).size;
  if (uVar19 == 0) {
    ra_reset(&x1->high_low_container);
    return;
  }
  uVar23 = *(x1->high_low_container).keys;
  local_7a = *(x2->high_low_container).keys;
  local_48 = (ulong)(1 - uVar19);
  local_60 = 0;
  uVar8 = 0;
  uVar21 = 0;
  local_50 = x2;
LAB_00118674:
  do {
    uVar15 = uVar8 & 0xffffffff;
    iVar5 = (int)uVar8;
    iVar20 = (int)uVar21;
    lVar14 = (long)iVar20;
    local_38 = lVar14 * 8;
    lVar25 = 0;
    while( true ) {
      uVar8 = uVar15 + lVar25;
      iVar24 = (int)lVar25;
      uVar22 = (uint)local_60;
      if (uVar23 == local_7a) break;
      iVar9 = (int)(lVar25 + uVar21);
      if (local_7a <= uVar23) {
        puVar4 = (local_50->high_low_container).keys;
        uVar13 = (local_50->high_low_container).size;
        uVar15 = (ulong)uVar13;
        uVar18 = uVar22 + 1;
        if (((int)uVar13 <= (int)uVar18) || (uVar23 <= puVar4[(int)uVar18])) {
          uVar15 = (ulong)uVar18;
          goto LAB_001187fe;
        }
        uVar22 = uVar22 + 2;
        iVar9 = 1;
        if ((int)uVar13 <= (int)uVar22) goto LAB_001187e5;
        iVar9 = 1;
        goto LAB_001187c9;
      }
      if (iVar9 != (int)uVar8) {
        if ((x1->high_low_container).size <= iVar9) goto LAB_00118b54;
        ppvVar2 = (x1->high_low_container).containers;
        pvVar3 = ppvVar2[uVar8 & 0xffff];
        uVar11 = (x1->high_low_container).typecodes[uVar8 & 0xffff];
        (x1->high_low_container).keys[lVar14 + lVar25] = uVar23;
        ppvVar2[lVar14 + lVar25] = pvVar3;
        (x1->high_low_container).typecodes[lVar25 + lVar14] = uVar11;
      }
      if ((int)local_48 + iVar5 + iVar24 == 0) {
        begin = iVar5 + iVar24 + 1;
        uVar21 = (ulong)(iVar24 + iVar20 + 1);
        goto LAB_00118aed;
      }
      uVar23 = (x1->high_low_container).keys[(ushort)((short)uVar15 + (short)lVar25 + 1)];
      lVar25 = lVar25 + 1;
    }
    uVar13 = iVar5 + iVar24 & 0xffff;
    bVar1 = (x1->high_low_container).typecodes[uVar13];
    paVar17 = (array_container_t *)(x1->high_low_container).containers[uVar13];
    type2 = (local_50->high_low_container).typecodes[uVar22 & 0xffff];
    paVar10 = (array_container_t *)(local_50->high_low_container).containers[uVar22 & 0xffff];
    local_58 = uVar12;
    local_54 = uVar19;
    local_40 = uVar21;
    if (bVar1 == 4) {
      local_78 = (array_container_t *)container_andnot(paVar17,'\x04',paVar10,type2,&local_7b);
      shared_container_free((shared_container_t *)paVar17);
      iVar9 = (int)local_40;
      paVar17 = local_78;
      goto LAB_0011899b;
    }
    if (type2 == 4) {
      type2 = *(byte *)&paVar10->array;
      if (type2 == 4) goto LAB_00118bb1;
      paVar10 = *(array_container_t **)paVar10;
    }
    local_70 = (array_container_t *)0x0;
    switch((uint)type2 + (uint)bVar1 * 4) {
    case 5:
      _Var7 = bitset_bitset_container_iandnot
                        ((bitset_container_t *)paVar17,(bitset_container_t *)paVar10,&local_70);
      goto LAB_0011895d;
    case 6:
      _Var7 = bitset_array_container_iandnot((bitset_container_t *)paVar17,paVar10,&local_70);
      goto LAB_0011895d;
    case 7:
      _Var7 = bitset_run_container_iandnot
                        ((bitset_container_t *)paVar17,(run_container_t *)paVar10,&local_70);
LAB_0011895d:
      local_7b = '\x02' - _Var7;
      paVar17 = local_70;
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x17cd,
                    "container_t *container_iandnot(container_t *, uint8_t, const container_t *, uint8_t, uint8_t *)"
                   );
    case 9:
      local_7b = '\x02';
      local_78 = paVar17;
      array_bitset_container_andnot(paVar17,(bitset_container_t *)paVar10,paVar17);
      paVar17 = local_78;
      break;
    case 10:
      local_78 = paVar17;
      array_container_andnot(paVar17,paVar10,paVar17);
      local_7b = '\x02';
      paVar17 = local_78;
      break;
    case 0xb:
      local_7b = '\x02';
      local_78 = paVar17;
      array_run_container_andnot(paVar17,(run_container_t *)paVar10,paVar17);
      paVar17 = local_78;
      break;
    case 0xd:
      local_78 = paVar17;
      _Var7 = run_bitset_container_andnot
                        ((run_container_t *)paVar17,(bitset_container_t *)paVar10,&local_70);
      local_64 = CONCAT31(local_64._1_3_,_Var7);
      run_container_free((run_container_t *)local_78);
      local_7b = '\x02' - (char)local_64;
      paVar17 = local_70;
      break;
    case 0xe:
      local_78 = paVar17;
      local_64 = run_array_container_andnot((run_container_t *)paVar17,paVar10,&local_70);
      goto LAB_0011891c;
    case 0xf:
      local_78 = paVar17;
      local_64 = run_run_container_andnot
                           ((run_container_t *)paVar17,(run_container_t *)paVar10,&local_70);
LAB_0011891c:
      run_container_free((run_container_t *)local_78);
      local_7b = (uint8_t)local_64;
      paVar17 = local_70;
    }
    iVar9 = (int)local_40;
LAB_0011899b:
    paVar10 = paVar17;
    uVar11 = local_7b;
    if (local_7b == '\x04') {
      uVar11 = *(uint8_t *)&paVar17->array;
      if (uVar11 == '\x04') {
LAB_00118bb1:
        __assert_fail("*type != SHARED_CONTAINER_TYPE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1062,
                      "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
      }
      paVar10 = *(array_container_t **)paVar17;
    }
    if ((uVar11 == '\x03') || (uVar11 == '\x02')) {
      bVar26 = 0 < paVar10->cardinality;
    }
    else {
      if (uVar11 != '\x01') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x11c6,"_Bool container_nonzero_cardinality(const container_t *, uint8_t)");
      }
      if (paVar10->cardinality == -1) {
        if (*(long *)paVar10->array == 0) {
          uVar8 = 0xffffffffffffffff;
          do {
            if (uVar8 == 0x3fe) {
              uVar16 = 0x3ff;
              break;
            }
            uVar16 = uVar8 + 1;
            lVar14 = uVar8 * 4;
            uVar8 = uVar16;
          } while (*(long *)(paVar10->array + lVar14 + 8) == 0);
          bVar26 = 0x3fe < uVar16;
        }
        else {
          bVar26 = false;
        }
      }
      else {
        bVar26 = paVar10->cardinality == 0;
      }
      bVar26 = (bool)(bVar26 ^ 1);
    }
    if (bVar26) {
      if ((x1->high_low_container).size <= (int)(uVar21 + lVar25)) {
LAB_00118b54:
        __assert_fail("i < ra->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1a55,
                      "void ra_replace_key_and_container_at_index(roaring_array_t *, int32_t, uint16_t, container_t *, uint8_t)"
                     );
      }
      uVar21 = (ulong)(iVar9 + iVar24 + 1);
      (x1->high_low_container).keys[iVar20 + lVar25] = uVar23;
      *(array_container_t **)((long)(x1->high_low_container).containers + lVar25 * 8 + local_38) =
           paVar17;
      (x1->high_low_container).typecodes[lVar25 + iVar20] = local_7b;
    }
    else {
      container_free(paVar17,local_7b);
      uVar21 = uVar21 + lVar25 & 0xffffffff;
    }
    uVar8 = uVar15 + lVar25 + 1;
    uVar22 = (int)local_60 + 1;
    uVar19 = local_54;
    if (uVar22 == local_58 || iVar24 + (int)local_48 + iVar5 == 0) {
      begin = iVar5 + iVar24 + 1;
LAB_00118aed:
      new_begin = (uint32_t)uVar21;
      if (uVar19 - begin != 0 && (int)begin <= (int)uVar19) {
        if ((int)new_begin < (int)begin) {
          ra_copy_range(&x1->high_low_container,begin,uVar19,new_begin);
        }
        new_begin = (uVar19 - begin) + new_begin;
      }
      if ((int)new_begin <= (x1->high_low_container).size) {
        (x1->high_low_container).size = new_begin;
        return;
      }
      __assert_fail("new_length <= ra->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x47af,"void ra_downsize(roaring_array_t *, int32_t)");
    }
    uVar23 = (x1->high_low_container).keys[(uint)uVar8 & 0xffff];
    local_7a = (local_50->high_low_container).keys[uVar22 & 0xffff];
    uVar12 = local_58;
    local_60 = (ulong)uVar22;
  } while( true );
  while( true ) {
    iVar6 = iVar9 * 2;
    uVar22 = uVar18 + iVar9 * 2;
    iVar9 = iVar6;
    if ((int)uVar13 <= (int)uVar22) break;
LAB_001187c9:
    if (uVar23 <= puVar4[(int)uVar22]) goto LAB_001187ec;
  }
LAB_001187e5:
  uVar22 = uVar13 - 1;
LAB_001187ec:
  if (puVar4[(int)uVar22] != uVar23) {
    if (puVar4[(int)uVar22] < uVar23) goto LAB_001187fe;
    if ((iVar9 >> 1) + uVar18 + 1 != uVar22) {
      uVar18 = (iVar9 >> 1) + uVar18;
      do {
        uVar13 = (int)(uVar18 + uVar22) >> 1;
        uVar15 = (ulong)uVar13;
        if (puVar4[(int)uVar13] == uVar23) break;
        if (puVar4[(int)uVar13] < uVar23) {
          uVar15 = (ulong)uVar22;
          uVar18 = uVar13;
        }
        uVar22 = (uint)uVar15;
      } while (uVar18 + 1 != uVar22);
      goto LAB_001187fe;
    }
  }
  uVar15 = (ulong)uVar22;
LAB_001187fe:
  if ((uint)uVar15 == uVar12) {
    begin = iVar5 + iVar24;
    uVar21 = (ulong)(uint)(iVar20 + iVar24);
    goto LAB_00118aed;
  }
  local_7a = puVar4[uVar15 & 0xffff];
  uVar21 = lVar25 + uVar21 & 0xffffffff;
  local_60 = uVar15;
  goto LAB_00118674;
}

Assistant:

void roaring_bitmap_andnot_inplace(roaring_bitmap_t *x1,
                                   const roaring_bitmap_t *x2) {
    assert(x1 != x2);

    uint8_t result_type = 0;
    int length1 = x1->high_low_container.size;
    const int length2 = x2->high_low_container.size;
    int intersection_size = 0;

    if (0 == length2) return;

    if (0 == length1) {
        roaring_bitmap_clear(x1);
        return;
    }

    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);

            // We do the computation "in place" only when c1 is not a shared container.
            // Rationale: using a shared container safely with in place computation would
            // require making a copy and then doing the computation in place which is likely
            // less efficient than avoiding in place entirely and always generating a new
            // container.

            container_t *c;
            if (type1 == SHARED_CONTAINER_TYPE) {
                c = container_andnot(c1, type1, c2, type2, &result_type);
                shared_container_free(CAST_shared(c1));  // release
            }
            else {
                c = container_iandnot(c1, type1, c2, type2, &result_type);
            }

            if (container_nonzero_cardinality(c, result_type)) {
                ra_replace_key_and_container_at_index(&x1->high_low_container,
                                                      intersection_size++, s1,
                                                      c, result_type);
            } else {
                container_free(c, result_type);
            }

            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        } else if (s1 < s2) {  // s1 < s2
            if (pos1 != intersection_size) {
                container_t *c1 = ra_get_container_at_index(
                                        &x1->high_low_container, pos1, &type1);

                ra_replace_key_and_container_at_index(&x1->high_low_container,
                                                      intersection_size, s1, c1,
                                                      type1);
            }
            intersection_size++;
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);

        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
        }
    }

    if (pos1 < length1) {
        // all containers between intersection_size and
        // pos1 are junk.  However, they have either been moved
        // (thus still referenced) or involved in an iandnot
        // that will clean up all containers that could not be reused.
        // Thus we should not free the junk containers between
        // intersection_size and pos1.
        if (pos1 > intersection_size) {
            // left slide of remaining items
            ra_copy_range(&x1->high_low_container, pos1, length1,
                          intersection_size);
        }
        // else current placement is fine
        intersection_size += (length1 - pos1);
    }
    ra_downsize(&x1->high_low_container, intersection_size);
}